

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_io.c
# Opt level: O0

int itf8_decode(cram_fd *fd,int32_t *val_p)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  int i;
  int32_t val;
  int32_t *val_p_local;
  cram_fd *fd_local;
  
  uVar1 = hgetc(fd->fp);
  if (uVar1 == 0xffffffff) {
    fd_local._4_4_ = -1;
  }
  else {
    uVar2 = uVar1 & itf8_decode::nbits[(int)uVar1 >> 4];
    switch(itf8_decode::nbytes[(int)uVar1 >> 4]) {
    case 0:
      *val_p = uVar2;
      fd_local._4_4_ = 1;
      break;
    case 1:
      uVar1 = hgetc(fd->fp);
      *val_p = uVar2 << 8 | uVar1 & 0xff;
      fd_local._4_4_ = 2;
      break;
    case 2:
      uVar1 = hgetc(fd->fp);
      uVar3 = hgetc(fd->fp);
      *val_p = (uVar2 << 8 | uVar1 & 0xff) << 8 | uVar3 & 0xff;
      fd_local._4_4_ = 3;
      break;
    case 3:
      uVar1 = hgetc(fd->fp);
      uVar3 = hgetc(fd->fp);
      uVar4 = hgetc(fd->fp);
      *val_p = ((uVar2 << 8 | uVar1 & 0xff) << 8 | uVar3 & 0xff) << 8 | uVar4 & 0xff;
      fd_local._4_4_ = 4;
      break;
    case 4:
      uVar1 = hgetc(fd->fp);
      uVar3 = hgetc(fd->fp);
      uVar4 = hgetc(fd->fp);
      uVar5 = hgetc(fd->fp);
      *val_p = (((uVar2 << 8 | uVar1 & 0xff) << 8 | uVar3 & 0xff) << 8 | uVar4 & 0xff) << 4 |
               uVar5 & 0xf;
    default:
      fd_local._4_4_ = 5;
    }
  }
  return fd_local._4_4_;
}

Assistant:

int itf8_decode(cram_fd *fd, int32_t *val_p) {
    static int nbytes[16] = {
	0,0,0,0, 0,0,0,0,                               // 0000xxxx - 0111xxxx
	1,1,1,1,                                        // 1000xxxx - 1011xxxx
	2,2,                                            // 1100xxxx - 1101xxxx
	3,                                              // 1110xxxx
	4,                                              // 1111xxxx
    };

    static int nbits[16] = {
	0x7f, 0x7f, 0x7f, 0x7f, 0x7f, 0x7f, 0x7f, 0x7f, // 0000xxxx - 0111xxxx
	0x3f, 0x3f, 0x3f, 0x3f,                         // 1000xxxx - 1011xxxx
	0x1f, 0x1f,                                     // 1100xxxx - 1101xxxx
	0x0f,                                           // 1110xxxx
	0x0f,                                           // 1111xxxx
    };

    int32_t val = hgetc(fd->fp);
    if (val == -1)
	return -1;

    int i = nbytes[val>>4];
    val &= nbits[val>>4];

    switch(i) {
    case 0:
	*val_p = val;
	return 1;

    case 1:
	val = (val<<8) | (unsigned char)hgetc(fd->fp);
	*val_p = val;
	return 2;

    case 2:
	val = (val<<8) | (unsigned char)hgetc(fd->fp);
	val = (val<<8) | (unsigned char)hgetc(fd->fp);
	*val_p = val;
	return 3;

    case 3:
	val = (val<<8) | (unsigned char)hgetc(fd->fp);
	val = (val<<8) | (unsigned char)hgetc(fd->fp);
	val = (val<<8) | (unsigned char)hgetc(fd->fp);
	*val_p = val;
	return 4;

    case 4: // really 3.5 more, why make it different?
	val = (val<<8) | (unsigned char)hgetc(fd->fp);
	val = (val<<8) | (unsigned char)hgetc(fd->fp);
	val = (val<<8) | (unsigned char)hgetc(fd->fp);
	val = (val<<4) | (((unsigned char)hgetc(fd->fp)) & 0x0f);
	*val_p = val;
    }

    return 5;
}